

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void anon_unknown.dwarf_6ac82::Dilate
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint32_t dilationX
               ,uint32_t dilationY,uint8_t value)

{
  byte *pbVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  void *pvVar8;
  byte *pbVar9;
  byte bVar10;
  uchar *puVar11;
  long lVar12;
  uchar *puVar13;
  ulong uVar14;
  uint8_t *imageXStart;
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  uint uVar19;
  uchar *puVar20;
  undefined8 *puVar21;
  uchar *puVar22;
  ulong uVar23;
  byte *local_a0;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar23 = (ulong)(width >> 1);
  if (dilationX <= width >> 1) {
    uVar23 = (ulong)dilationX;
  }
  uVar4 = height >> 1;
  if (dilationY <= height >> 1) {
    uVar4 = dilationY;
  }
  uVar6 = (ulong)width;
  uVar14 = (ulong)x;
  if ((int)uVar23 != 0) {
    puVar7 = (undefined8 *)operator_new__((ulong)(width * 2) << 3);
    uVar2 = image->_rowSize;
    if (uVar2 * height != 0) {
      uVar16 = (ulong)(uVar2 * y);
      puVar11 = image->_data;
      pbVar15 = puVar11 + uVar16 + uVar14;
      pbVar1 = pbVar15 + uVar2 * height;
      puVar13 = puVar11 + uVar14 + uVar16 + 1;
      puVar11 = puVar11 + ((uVar14 + 1 + uVar16) - uVar23);
      do {
        if (width != 1) {
          bVar10 = *pbVar15;
          lVar12 = 0;
          uVar19 = 0;
          uVar16 = uVar6;
          do {
            uVar16 = uVar16 - 1;
            uVar17 = uVar16;
            if ((long)uVar23 < (long)uVar16) {
              uVar17 = uVar23;
            }
            if (pbVar15[lVar12 + 1] != bVar10) {
              bVar10 = ~bVar10;
              pbVar9 = puVar11 + lVar12;
              if (lVar12 + 1 < (long)uVar23) {
                pbVar9 = pbVar15;
              }
              puVar7[uVar19] = pbVar9;
              puVar7[uVar6 + uVar19] = puVar13 + lVar12 + uVar17;
              uVar19 = uVar19 + 1;
            }
            lVar12 = lVar12 + 1;
          } while ((1 - uVar6) + lVar12 != 0);
          if (uVar19 != 0) {
            uVar16 = (ulong)uVar19;
            puVar21 = puVar7;
            do {
              pvVar8 = (void *)*puVar21;
              if (pvVar8 != (void *)puVar21[uVar6]) {
                memset(pvVar8,(uint)value,(long)puVar21[uVar6] - (long)pvVar8);
              }
              puVar21 = puVar21 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
        }
        pbVar15 = pbVar15 + uVar2;
        puVar13 = puVar13 + uVar2;
        puVar11 = puVar11 + uVar2;
      } while (pbVar15 != pbVar1);
    }
    operator_delete__(puVar7);
  }
  if (uVar4 != 0) {
    pvVar8 = operator_new__((ulong)(height * 2) << 3);
    if (width != 0) {
      uVar2 = image->_rowSize;
      uVar23 = (ulong)uVar2;
      puVar13 = image->_data;
      uVar19 = uVar2 * height;
      local_a0 = puVar13 + y * uVar2 + uVar14;
      lVar12 = uVar14 + y * uVar2;
      pbVar1 = local_a0 + uVar6;
      puVar11 = puVar13 + (ulong)(uVar2 * uVar4) + lVar12;
      puVar13 = puVar13 + (lVar12 - (ulong)(uVar2 * uVar4));
      do {
        if (uVar2 != uVar19) {
          lVar12 = 0;
          bVar10 = *local_a0;
          pbVar15 = local_a0;
          puVar20 = puVar11;
          uVar14 = 0;
          puVar22 = puVar13;
          do {
            uVar6 = uVar14;
            if (pbVar15[uVar23] != bVar10) {
              bVar10 = ~bVar10;
              uVar5 = ((int)lVar12 + uVar2) / uVar2;
              pbVar9 = puVar22 + uVar23;
              if (uVar5 < uVar4) {
                pbVar9 = local_a0;
              }
              *(byte **)((long)pvVar8 + uVar14 * 8) = pbVar9;
              pbVar9 = puVar20 + uVar23;
              if (height - uVar5 < uVar4) {
                pbVar9 = local_a0 + uVar19;
              }
              uVar6 = (ulong)((int)uVar14 + 1);
              *(byte **)((long)pvVar8 + uVar14 * 8 + (ulong)height * 8) = pbVar9;
            }
            lVar12 = lVar12 + uVar23;
            pbVar15 = pbVar15 + uVar23;
            puVar20 = puVar20 + uVar23;
            puVar22 = puVar22 + uVar23;
            uVar14 = uVar6;
          } while ((uVar23 - uVar19) + lVar12 != 0);
          if ((int)uVar6 != 0) {
            uVar14 = 0;
            do {
              puVar3 = *(uint8_t **)((long)pvVar8 + uVar14 * 8 + (ulong)height * 8);
              for (puVar18 = *(uint8_t **)((long)pvVar8 + uVar14 * 8); puVar18 != puVar3;
                  puVar18 = puVar18 + uVar23) {
                *puVar18 = value;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar6);
          }
        }
        puVar11 = puVar11 + 1;
        puVar13 = puVar13 + 1;
        local_a0 = local_a0 + 1;
      } while (local_a0 != pbVar1);
    }
    operator_delete__(pvVar8);
    return;
  }
  return;
}

Assistant:

void Dilate( PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint32_t dilationX, uint32_t dilationY, uint8_t value )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );


        if( dilationX > width / 2 )
            dilationX = width / 2;
        if( dilationY > height / 2 )
            dilationY = height / 2;

        if( dilationX > 0u ) {
            const int32_t dilateX = static_cast<int32_t>(dilationX);

            uint8_t ** startPos = new uint8_t *[2 * width];
            uint8_t ** endPos = startPos + width;

            const uint32_t rowSize = image.rowSize();
            uint8_t * imageY    = image.data() + y * rowSize + x;
            uint8_t * imageYEnd = imageY + height * rowSize;

            for( ; imageY != imageYEnd; imageY += rowSize ) {
                uint32_t pairCount = 0u;

                uint8_t previousValue = *imageY;

                uint8_t * imageXStart = imageY;
                uint8_t * imageX      = imageXStart + 1;
                uint8_t * imageXEnd   = imageXStart + width;

                for( ; imageX != imageXEnd; ++imageX ) {
                    if( (*imageX) != previousValue ) {
                        if( imageX - imageXStart < dilateX )
                            startPos[pairCount] = imageXStart;
                        else
                            startPos[pairCount] = imageX - dilateX;

                        if( imageXEnd - imageX < dilateX )
                            endPos[pairCount] = imageXEnd;
                        else
                            endPos[pairCount] = imageX + dilateX;

                        previousValue = 0xFFu ^ previousValue;
                        ++pairCount;
                    }
                }

                for( uint32_t i = 0u; i < pairCount; ++i ) {
                    imageX    = startPos[i];
                    imageXEnd = endPos[i];

                    for( ; imageX != imageXEnd; ++imageX )
                        (*imageX) = value;
                }
            }

            delete[] startPos;
        }

        if( dilationY > 0u ) {
            uint8_t ** startPos = new uint8_t *[2 * height];
            uint8_t ** endPos = startPos + height;

            const uint32_t rowSize = image.rowSize();
            uint8_t * imageX    = image.data() + y * rowSize + x;
            uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX ) {
                uint32_t pairCount = 0u;

                uint8_t previousValue = *imageX;

                uint8_t * imageYStart = imageX;
                uint8_t * imageY      = imageYStart + rowSize;
                uint8_t * imageYEnd   = imageYStart + height * rowSize;

                for( ; imageY != imageYEnd; imageY += rowSize ) {
                    if( (*imageY) != previousValue ) {
                        const uint32_t rowId = static_cast<uint32_t>(imageY - imageYStart) / rowSize;

                        if( rowId < dilationY )
                            startPos[pairCount] = imageYStart;
                        else
                            startPos[pairCount] = imageY - dilationY * rowSize;

                        if( height - rowId < dilationY )
                            endPos[pairCount] = imageYEnd;
                        else
                            endPos[pairCount] = imageY + dilationY * rowSize;

                        previousValue = 0xFFu ^ previousValue;
                        ++pairCount;
                    }
                }

                for( uint32_t i = 0u; i < pairCount; ++i ) {
                    imageY    = startPos[i];
                    imageYEnd = endPos[i];

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*imageY) = value;
                }
            }

            delete[] startPos;
        }
    }